

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.h
# Opt level: O2

avl_node_t * avl_iter_next(avl_iter_t *iter)

{
  undefined8 *puVar1;
  avl_node_t *paVar2;
  size_t sVar3;
  avl_node *paVar4;
  avl_node_t *paVar5;
  bool bVar6;
  
  if (iter[1].height == 0) {
    return (avl_node_t *)0x0;
  }
  sVar3 = iter->height;
  puVar1 = (undefined8 *)iter[sVar3 + 1].height;
  while (puVar1 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*puVar1;
    iter[sVar3 + 2].height = (size_t)puVar1;
    sVar3 = sVar3 + 1;
    iter->height = sVar3;
  }
  paVar5 = (avl_node_t *)iter[sVar3].height;
  paVar2 = paVar5;
  paVar4 = paVar5->right;
  if (paVar4 == (avl_node *)0x0) {
    do {
      sVar3 = sVar3 - 1;
      if (sVar3 == 0) break;
      bVar6 = paVar5 == ((avl_node_t *)iter[sVar3].height)->right;
      paVar5 = (avl_node_t *)iter[sVar3].height;
    } while (bVar6);
    paVar4 = (avl_node *)0x0;
    iter->height = sVar3;
  }
  iter[sVar3 + 1].height = (size_t)paVar4;
  return paVar2;
}

Assistant:

static inline avl_node_t*
avl_iter_next(avl_iter_t *iter)
{
    /* when first node is NULL, we're done */
    if (iter->nodes[0] == NULL) return NULL;

    /* if the head is not NULL, first entry... */
    while (iter->nodes[iter->height] != NULL) {
        iter->nodes[iter->height+1] = iter->nodes[iter->height]->left;
        iter->height++;
    }

    /* head is now NULL, take parent as result */
    avl_node_t *result = iter->nodes[iter->height-1];

    if (result->right != NULL) {
        /* if we can go right, do that */
        iter->nodes[iter->height] = result->right;
    } else {
        /* cannot go right, backtrack */
        do {
            iter->height--;
        } while (iter->height > 0 && iter->nodes[iter->height] == iter->nodes[iter->height-1]->right);
        iter->nodes[iter->height] = NULL; /* set head to NULL: second entry */
    }

    return result;
}